

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfoMB *
embree::avx::createPrimRefArrayMSMBlur
          (PrimInfoMB *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  size_t sVar4;
  BBox1f BVar5;
  BBox1f BVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  task *ptVar10;
  Geometry *pGVar11;
  runtime_error *prVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  undefined1 in_register_00001208 [56];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  undefined1 auVar37 [16];
  range<unsigned_long> rVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  size_t taskCount;
  small_object_allocator alloc;
  Iterator2 iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  undefined1 local_4e21;
  Geometry *local_4e20;
  BBox1f local_4e18;
  long **local_4e10;
  task_traits local_4e08;
  Scene *local_4e00;
  GTypeMask local_4df8;
  char local_4df0;
  mvector<PrimRefMB> *local_4de8;
  Scene **local_4de0;
  BuildProgressMonitor *local_4dd8;
  size_t local_4dd0;
  mvector<PrimRefMB> **local_4dc8;
  Scene **local_4dc0;
  mvector<PrimRefMB> *local_4db8;
  BBox1f *local_4db0;
  undefined4 local_4da8;
  undefined4 uStack_4da4;
  undefined4 uStack_4da0;
  undefined4 uStack_4d9c;
  undefined4 local_4d98;
  undefined4 uStack_4d94;
  undefined4 uStack_4d90;
  undefined4 uStack_4d8c;
  undefined4 local_4d88;
  undefined4 uStack_4d84;
  undefined4 uStack_4d80;
  undefined4 uStack_4d7c;
  undefined4 local_4d78;
  undefined4 uStack_4d74;
  undefined4 uStack_4d70;
  undefined4 uStack_4d6c;
  undefined4 local_4d68;
  undefined4 uStack_4d64;
  undefined4 uStack_4d60;
  undefined4 uStack_4d5c;
  undefined4 local_4d58;
  undefined4 uStack_4d54;
  undefined4 uStack_4d50;
  undefined4 uStack_4d4c;
  unsigned_long local_4d48;
  unsigned_long uStack_4d40;
  size_t sStack_4d38;
  size_t sStack_4d30;
  float local_4d28;
  float fStack_4d24;
  float fStack_4d20;
  float fStack_4d1c;
  long *local_4d18;
  Geometry **local_4d10;
  undefined4 *local_4d08;
  Scene ***local_4d00;
  undefined1 *local_4cf8;
  mvector<PrimRefMB> ***local_4cf0;
  undefined8 local_4ce8;
  undefined4 local_4ce0;
  wait_context local_4cd8;
  task_group_context local_4cc8;
  long local_4c48 [64];
  ulong local_4a48 [64];
  Geometry *local_4848;
  ulong local_4840;
  undefined1 local_4838 [9344];
  undefined1 local_23b8 [9096];
  
  auVar40._8_56_ = in_register_00001208;
  auVar40._0_8_ = t0t1;
  local_4e18 = (BBox1f)vmovlps_avx(auVar40._0_16_);
  local_4848 = (Geometry *)0x0;
  local_4df0 = '\x01';
  uVar22 = 0;
  local_4e00 = scene;
  local_4df8 = types;
  local_4de8 = prims;
  local_4dd8 = progressMonitor;
  local_4dd0 = numPrimRefs;
  (**progressMonitor->_vptr_BuildProgressMonitor)();
  sVar16 = (local_4e00->geometries).size_active;
  if (sVar16 != 0) {
    uVar22 = 0;
    sVar19 = 0;
    do {
      progressMonitor = (BuildProgressMonitor *)(local_4e00->geometries).items[sVar19].ptr;
      if (((((Geometry *)progressMonitor == (Geometry *)0x0) ||
           (((uint)((Geometry *)progressMonitor)->field_8 >> 0x15 & 1) == 0)) ||
          ((local_4df8 & 1 << (SUB41(((Geometry *)progressMonitor)->field_8,0) & 0x1f)) == ~MTY_ALL)
          ) || ((bool)local_4df0 != (((Geometry *)progressMonitor)->numTimeSteps != 1))) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)((Geometry *)progressMonitor)->numPrimitives;
      }
      uVar22 = uVar22 + uVar13;
      sVar19 = sVar19 + 1;
    } while (sVar16 != sVar19);
  }
  local_4840 = uVar22;
  iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar13 = uVar22 + 0x3ff >> 10;
  if ((ulong)(long)iVar8 < uVar13) {
    uVar13 = (long)iVar8;
  }
  uVar17 = 0x40;
  if (uVar13 < 0x40) {
    uVar17 = uVar13;
  }
  local_4848 = (Geometry *)(uVar17 + (uVar17 == 0));
  local_4c48[0] = 0;
  local_4a48[0] = 0;
  if (1 < uVar13) {
    uVar17 = 0;
    uVar13 = uVar22 / (ulong)local_4848;
    progressMonitor = (BuildProgressMonitor *)0x1;
    lVar20 = 0;
    do {
      pGVar11 = (local_4e00->geometries).items[lVar20].ptr;
      if (((pGVar11 == (Geometry *)0x0) || (((uint)pGVar11->field_8 >> 0x15 & 1) == 0)) ||
         (((local_4df8 & 1 << (SUB41(pGVar11->field_8,0) & 0x1f)) == ~MTY_ALL ||
          ((bool)local_4df0 != (pGVar11->numTimeSteps != 1))))) {
        uVar23 = 0;
      }
      else {
        uVar23 = (ulong)pGVar11->numPrimitives;
      }
      if (uVar23 == 0) {
        lVar15 = 0;
      }
      else {
        uVar14 = (long)((long)&(((Geometry *)progressMonitor)->super_RefCount)._vptr_RefCount + 1) *
                 uVar22;
        lVar15 = 0;
        uVar21 = 0;
        do {
          uVar9 = uVar13;
          uVar13 = uVar9;
          if ((uVar23 + uVar17 + lVar15 < uVar9) || (local_4848 <= progressMonitor)) break;
          local_4c48[(long)progressMonitor] = lVar20;
          uVar21 = uVar21 + (uVar9 - uVar17);
          local_4a48[(long)progressMonitor] = uVar21;
          progressMonitor =
               (BuildProgressMonitor *)
               ((long)&(((Geometry *)progressMonitor)->super_RefCount)._vptr_RefCount + 1);
          uVar13 = uVar14 / (ulong)local_4848;
          lVar15 = -uVar21;
          uVar14 = uVar14 + uVar22;
          uVar17 = uVar9;
        } while (uVar21 < uVar23);
      }
      uVar17 = uVar17 + uVar23 + lVar15;
      lVar20 = lVar20 + 1;
    } while (progressMonitor < local_4848);
  }
  pGVar11 = local_4848;
  local_4da8 = 0x7f800000;
  uStack_4da4 = 0x7f800000;
  uStack_4da0 = 0x7f800000;
  uStack_4d9c = 0x7f800000;
  local_4d98 = 0xff800000;
  uStack_4d94 = 0xff800000;
  uStack_4d90 = 0xff800000;
  uStack_4d8c = 0xff800000;
  local_4d88 = 0x7f800000;
  uStack_4d84 = 0x7f800000;
  uStack_4d80 = 0x7f800000;
  uStack_4d7c = 0x7f800000;
  local_4d78 = 0xff800000;
  uStack_4d74 = 0xff800000;
  uStack_4d70 = 0xff800000;
  uStack_4d6c = 0xff800000;
  local_4d68 = 0x7f800000;
  uStack_4d64 = 0x7f800000;
  uStack_4d60 = 0x7f800000;
  uStack_4d5c = 0x7f800000;
  local_4d58 = 0xff800000;
  uStack_4d54 = 0xff800000;
  uStack_4d50 = 0xff800000;
  uStack_4d4c = 0xff800000;
  local_4d48 = 0;
  uStack_4d40 = 0;
  sStack_4d38 = 0;
  sStack_4d30 = 0;
  local_4d28 = 0.0;
  auVar47._8_4_ = 0x3f800000;
  auVar47._0_8_ = &DAT_3f8000003f800000;
  auVar47._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar47);
  fStack_4d24 = (float)uVar1;
  fStack_4d20 = (float)((ulong)uVar1 >> 0x20);
  fStack_4d1c = 0.0;
  local_4db8 = local_4de8;
  local_4db0 = &local_4e18;
  local_4de0 = &local_4e00;
  local_4d00 = &local_4de0;
  local_4cf0 = &local_4dc8;
  local_4d10 = &local_4e20;
  local_4d18 = local_4c48;
  local_4cf8 = &local_4e21;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4e20 = local_4848;
  local_4dc8 = &local_4db8;
  local_4dc0 = local_4de0;
  local_4d08 = &local_4da8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4e10 = &local_4d18;
  if (pGVar11 != (Geometry *)0x0) {
    local_4e08.m_version_and_traits = 0;
    ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
    ptVar10->m_reserved[2] = 0;
    ptVar10->m_reserved[3] = 0;
    ptVar10->m_reserved[4] = 0;
    ptVar10->m_reserved[5] = 0;
    (ptVar10->super_task_traits).m_version_and_traits = 0;
    ptVar10->m_reserved[0] = 0;
    ptVar10->m_reserved[1] = 0;
    ptVar10->m_reserved[2] = 0;
    ptVar10->_vptr_task = (_func_int **)&PTR__task_0221c2b8;
    ptVar10[1]._vptr_task = (_func_int **)pGVar11;
    ptVar10[1].super_task_traits.m_version_and_traits = 0;
    ptVar10[1].m_reserved[0] = 1;
    ptVar10[1].m_reserved[1] = (uint64_t)&local_4e10;
    ptVar10[1].m_reserved[2] = 0;
    ptVar10[1].m_reserved[3] = 1;
    iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar10[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
    ptVar10[1].m_reserved[5] = ((long)iVar8 & 0x3fffffffffffffffU) * 2;
    ptVar10[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
    local_4ce8 = 0;
    local_4ce0 = 1;
    local_4cd8.m_version_and_traits = 1;
    local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar10[1].m_reserved[4] = (uint64_t)&local_4ce8;
    tbb::detail::r1::execute_and_wait(ptVar10,&local_4cc8,&local_4cd8,&local_4cc8);
  }
  cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar7 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar25.m128[1] = (float)uStack_4da4;
  aVar25.m128[0] = (float)local_4da8;
  aVar25.m128[2] = (float)uStack_4da0;
  aVar25.m128[3] = (float)uStack_4d9c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar25;
  aVar27.m128[1] = (float)uStack_4d94;
  aVar27.m128[0] = (float)local_4d98;
  aVar27.m128[2] = (float)uStack_4d90;
  aVar27.m128[3] = (float)uStack_4d8c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  aVar29.m128[1] = (float)uStack_4d84;
  aVar29.m128[0] = (float)local_4d88;
  aVar29.m128[2] = (float)uStack_4d80;
  aVar29.m128[3] = (float)uStack_4d7c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar29;
  aVar31.m128[1] = (float)uStack_4d74;
  aVar31.m128[0] = (float)local_4d78;
  aVar31.m128[2] = (float)uStack_4d70;
  aVar31.m128[3] = (float)uStack_4d6c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar31;
  aVar33.m128[1] = (float)uStack_4d64;
  aVar33.m128[0] = (float)local_4d68;
  aVar33.m128[2] = (float)uStack_4d60;
  aVar33.m128[3] = (float)uStack_4d5c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar33;
  aVar35.m128[1] = (float)uStack_4d54;
  aVar35.m128[0] = (float)local_4d58;
  aVar35.m128[2] = (float)uStack_4d50;
  aVar35.m128[3] = (float)uStack_4d4c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar35;
  (__return_storage_ptr__->object_range)._begin = local_4d48;
  (__return_storage_ptr__->object_range)._end = uStack_4d40;
  BVar5.upper = fStack_4d24;
  BVar5.lower = local_4d28;
  BVar6.upper = fStack_4d1c;
  BVar6.lower = fStack_4d20;
  __return_storage_ptr__->num_time_segments = sStack_4d38;
  __return_storage_ptr__->max_num_time_segments = sStack_4d30;
  __return_storage_ptr__->max_time_range = BVar5;
  __return_storage_ptr__->time_range = BVar6;
  if (local_4e20 != (Geometry *)0x0) {
    sVar16 = __return_storage_ptr__->num_time_segments;
    pauVar18 = (undefined1 (*) [16])local_4838;
    auVar37._8_8_ = 0;
    auVar37._0_4_ = (__return_storage_ptr__->max_time_range).lower;
    auVar37._4_4_ = (__return_storage_ptr__->max_time_range).upper;
    auVar40 = ZEXT864((ulong)__return_storage_ptr__->time_range);
    rVar38 = __return_storage_ptr__->object_range;
    sVar19 = __return_storage_ptr__->max_num_time_segments;
    pGVar11 = local_4e20;
    do {
      uVar22 = *(ulong *)(pauVar18[7] + 8);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)pauVar18[8];
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x240) = aVar25;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x241) = aVar27;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x242) = aVar29;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x243) = aVar31;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x244) = aVar33;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + 0x245) = aVar35;
      uVar2 = (__return_storage_ptr__->object_range)._end;
      sVar3 = __return_storage_ptr__->num_time_segments;
      sVar4 = __return_storage_ptr__->max_num_time_segments;
      *(unsigned_long *)pauVar18[0x246] = (__return_storage_ptr__->object_range)._begin;
      *(unsigned_long *)(pauVar18[0x246] + 8) = uVar2;
      *(size_t *)pauVar18[0x247] = sVar3;
      *(size_t *)(pauVar18[0x247] + 8) = sVar4;
      auVar39 = auVar40._0_16_;
      auVar47 = vmovlhps_avx(auVar37,auVar39);
      pauVar18[0x248] = auVar47;
      aVar25.m128 = (__m128)vminps_avx(aVar25.m128,*pauVar18);
      aVar27.m128 = (__m128)vmaxps_avx(aVar27.m128,pauVar18[1]);
      aVar29.m128 = (__m128)vminps_avx(aVar29.m128,pauVar18[2]);
      aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,pauVar18[3]);
      aVar33.m128 = (__m128)vminps_avx(aVar33.m128,pauVar18[4]);
      aVar35.m128 = (__m128)vmaxps_avx(aVar35.m128,pauVar18[5]);
      sVar16 = sVar16 + *(long *)pauVar18[7];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(pauVar18[8] + 8);
      auVar45 = vcmpps_avx(auVar39,auVar44,1);
      auVar41 = vinsertps_avx(auVar39,auVar44,0x50);
      auVar47 = vblendps_avx(auVar44,auVar39,2);
      auVar47 = vblendvps_avx(auVar47,auVar41,auVar45);
      auVar40 = ZEXT1664(auVar47);
      progressMonitor =
           (BuildProgressMonitor *)CONCAT71((int7)((ulong)progressMonitor >> 8),sVar19 < uVar22);
      auVar45 = vpshufd_avx(ZEXT416((uint)progressMonitor),0x50);
      auVar45 = vpslld_avx(auVar45,0x1f);
      auVar37 = vblendvps_avx(auVar37,auVar42,auVar45);
      if (sVar19 <= uVar22) {
        sVar19 = uVar22;
      }
      rVar38 = (range<unsigned_long>)vpaddq_avx((undefined1  [16])rVar38,pauVar18[6]);
      __return_storage_ptr__->object_range = rVar38;
      __return_storage_ptr__->num_time_segments = sVar16;
      __return_storage_ptr__->max_num_time_segments = sVar19;
      pauVar18 = pauVar18 + 9;
      pGVar11 = (Geometry *)&pGVar11[-1].field_0x5f;
    } while (pGVar11 != (Geometry *)0x0);
    auVar47 = vmovlhps_avx(auVar37,auVar47);
    (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar47._0_8_;
    (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar47._0_8_ >> 0x20);
    (__return_storage_ptr__->time_range).lower = (float)(int)auVar47._8_8_;
    (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar47._8_8_ >> 0x20);
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar27;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar29;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar31;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar33;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar35;
  if ((__return_storage_ptr__->object_range)._end - (__return_storage_ptr__->object_range)._begin !=
      local_4dd0) {
    (**local_4dd8->_vptr_BuildProgressMonitor)(local_4dd8,0);
    pGVar11 = local_4848;
    local_4da8 = 0x7f800000;
    uStack_4da4 = 0x7f800000;
    uStack_4da0 = 0x7f800000;
    uStack_4d9c = 0x7f800000;
    local_4d98 = 0xff800000;
    uStack_4d94 = 0xff800000;
    uStack_4d90 = 0xff800000;
    uStack_4d8c = 0xff800000;
    local_4d88 = 0x7f800000;
    uStack_4d84 = 0x7f800000;
    uStack_4d80 = 0x7f800000;
    uStack_4d7c = 0x7f800000;
    local_4d78 = 0xff800000;
    uStack_4d74 = 0xff800000;
    uStack_4d70 = 0xff800000;
    uStack_4d6c = 0xff800000;
    local_4d68 = 0x7f800000;
    uStack_4d64 = 0x7f800000;
    uStack_4d60 = 0x7f800000;
    uStack_4d5c = 0x7f800000;
    local_4d58 = 0xff800000;
    uStack_4d54 = 0xff800000;
    uStack_4d50 = 0xff800000;
    uStack_4d4c = 0xff800000;
    local_4d48 = 0;
    uStack_4d40 = 0;
    sStack_4d38 = 0;
    sStack_4d30 = 0;
    local_4d28 = 0.0;
    auVar45._8_4_ = 0x3f800000;
    auVar45._0_8_ = &DAT_3f8000003f800000;
    auVar45._12_4_ = 0x3f800000;
    uVar1 = vmovlps_avx(auVar45);
    fStack_4d24 = (float)uVar1;
    fStack_4d20 = (float)((ulong)uVar1 >> 0x20);
    fStack_4d1c = 0.0;
    local_4db8 = local_4de8;
    local_4db0 = &local_4e18;
    local_4de0 = &local_4e00;
    local_4e20 = local_4848;
    local_4d18 = local_4c48;
    local_4d10 = &local_4e20;
    local_4cf8 = &local_4e21;
    local_4cf0 = &local_4dc8;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4dc8 = &local_4db8;
    local_4dc0 = local_4de0;
    local_4d08 = &local_4da8;
    local_4d00 = &local_4de0;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4e10 = &local_4d18;
    if (pGVar11 != (Geometry *)0x0) {
      local_4e08.m_version_and_traits = 0;
      ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_4e08,0xc0);
      ptVar10->m_reserved[2] = 0;
      ptVar10->m_reserved[3] = 0;
      ptVar10->m_reserved[4] = 0;
      ptVar10->m_reserved[5] = 0;
      (ptVar10->super_task_traits).m_version_and_traits = 0;
      ptVar10->m_reserved[0] = 0;
      ptVar10->m_reserved[1] = 0;
      ptVar10->m_reserved[2] = 0;
      ptVar10->_vptr_task = (_func_int **)&PTR__task_0221c300;
      ptVar10[1]._vptr_task = (_func_int **)pGVar11;
      ptVar10[1].super_task_traits.m_version_and_traits = 0;
      ptVar10[1].m_reserved[0] = 1;
      ptVar10[1].m_reserved[1] = (uint64_t)&local_4e10;
      ptVar10[1].m_reserved[2] = 0;
      ptVar10[1].m_reserved[3] = 1;
      iVar8 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar10[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
      ptVar10[1].m_reserved[5] = ((long)iVar8 & 0x3fffffffffffffffU) * 2;
      ptVar10[2].super_task_traits.m_version_and_traits = local_4e08.m_version_and_traits;
      local_4ce8 = 0;
      local_4ce0 = 1;
      local_4cd8.m_version_and_traits = 1;
      local_4cd8.m_ref_count.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)1;
      ptVar10[1].m_reserved[4] = (uint64_t)&local_4ce8;
      tbb::detail::r1::execute_and_wait(ptVar10,&local_4cc8,&local_4cd8,&local_4cc8);
    }
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar7 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar36.m128[1] = (float)uStack_4da4;
    aVar36.m128[0] = (float)local_4da8;
    aVar36.m128[2] = (float)uStack_4da0;
    aVar36.m128[3] = (float)uStack_4d9c;
    aVar34.m128[1] = (float)uStack_4d94;
    aVar34.m128[0] = (float)local_4d98;
    aVar34.m128[2] = (float)uStack_4d90;
    aVar34.m128[3] = (float)uStack_4d8c;
    aVar32.m128[1] = (float)uStack_4d84;
    aVar32.m128[0] = (float)local_4d88;
    aVar32.m128[2] = (float)uStack_4d80;
    aVar32.m128[3] = (float)uStack_4d7c;
    aVar30.m128[1] = (float)uStack_4d74;
    aVar30.m128[0] = (float)local_4d78;
    aVar30.m128[2] = (float)uStack_4d70;
    aVar30.m128[3] = (float)uStack_4d6c;
    aVar28.m128[1] = (float)uStack_4d64;
    aVar28.m128[0] = (float)local_4d68;
    aVar28.m128[2] = (float)uStack_4d60;
    aVar28.m128[3] = (float)uStack_4d5c;
    aVar26.m128[1] = (float)uStack_4d54;
    aVar26.m128[0] = (float)local_4d58;
    aVar26.m128[2] = (float)uStack_4d50;
    aVar26.m128[3] = (float)uStack_4d4c;
    rVar38._end = uStack_4d40;
    rVar38._begin = local_4d48;
    auVar39._4_4_ = fStack_4d24;
    auVar39._0_4_ = local_4d28;
    auVar39._8_8_ = 0;
    auVar41._4_4_ = fStack_4d1c;
    auVar41._0_4_ = fStack_4d20;
    auVar41._8_8_ = 0;
    if (local_4e20 != (Geometry *)0x0) {
      pauVar18 = (undefined1 (*) [16])local_23b8;
      do {
        uVar22 = *(ulong *)(pauVar18[-0x241] + 8);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)pauVar18[-0x240];
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + -8) = aVar36;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + -7) = aVar34;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + -6) = aVar32;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + -5) = aVar30;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + -4) = aVar28;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar18 + -3) = aVar26;
        *(range<unsigned_long> *)(pauVar18 + -2) = rVar38;
        *(size_t *)pauVar18[-1] = sStack_4d38;
        *(size_t *)(pauVar18[-1] + 8) = sStack_4d30;
        auVar47 = vmovlhps_avx(auVar39,auVar41);
        *pauVar18 = auVar47;
        aVar36.m128 = (__m128)vminps_avx(aVar36.m128,pauVar18[-0x248]);
        aVar34.m128 = (__m128)vmaxps_avx(aVar34.m128,pauVar18[-0x247]);
        aVar32.m128 = (__m128)vminps_avx(aVar32.m128,pauVar18[-0x246]);
        aVar30.m128 = (__m128)vmaxps_avx(aVar30.m128,pauVar18[-0x245]);
        aVar28.m128 = (__m128)vminps_avx(aVar28.m128,pauVar18[-0x244]);
        aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,pauVar18[-0x243]);
        rVar38 = (range<unsigned_long>)vpaddq_avx((undefined1  [16])rVar38,pauVar18[-0x242]);
        sStack_4d38 = sStack_4d38 + *(long *)pauVar18[-0x241];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(pauVar18[-0x240] + 8);
        auVar37 = vcmpps_avx(auVar41,auVar46,1);
        auVar45 = vinsertps_avx(auVar41,auVar46,0x50);
        auVar47 = vblendps_avx(auVar46,auVar41,2);
        auVar41 = vblendvps_avx(auVar47,auVar45,auVar37);
        bVar24 = sStack_4d30 < uVar22;
        if (sStack_4d30 <= uVar22) {
          sStack_4d30 = uVar22;
        }
        auVar47 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar22 >> 8),bVar24)),0x50);
        auVar47 = vpslld_avx(auVar47,0x1f);
        auVar39 = vblendvps_avx(auVar39,auVar43,auVar47);
        pauVar18 = pauVar18 + 9;
        local_4e20 = (Geometry *)&local_4e20[-1].field_0x5f;
      } while (local_4e20 != (Geometry *)0x0);
    }
    auVar47 = vmovlhps_avx(auVar39,auVar41);
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar36;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar34;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar32;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar30;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar28;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar26;
    __return_storage_ptr__->object_range = rVar38;
    __return_storage_ptr__->num_time_segments = sStack_4d38;
    __return_storage_ptr__->max_num_time_segments = sStack_4d30;
    (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar47._0_8_;
    (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar47._0_8_ >> 0x20);
    (__return_storage_ptr__->time_range).lower = (float)(int)auVar47._8_8_;
    (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar47._8_8_ >> 0x20);
  }
  __return_storage_ptr__->time_range = local_4e18;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1)
    {
      ParallelForForPrefixSumState<PrimInfoMB> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfoMB {
          return mesh->createPrimRefMBArray(prims,t0t1,r,k,(unsigned)geomID);
      }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            return mesh->createPrimRefMBArray(prims,t0t1,r,base.size(),(unsigned)geomID);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
      }

      /* the BVH starts with that time range, even though primitives might have smaller/larger time range */
      pinfo.time_range = t0t1;
      return pinfo;
    }